

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

void __thiscall QMdiAreaPrivate::place(QMdiAreaPrivate *this,Placer *placer,QMdiSubWindow *child)

{
  QWidget *this_00;
  QPointer<QMdiSubWindow> *pQVar1;
  long lVar2;
  long lVar3;
  QWidgetData *pQVar4;
  bool bVar5;
  LayoutDirection LVar6;
  Representation extraout_var;
  long lVar7;
  QWidget *this_01;
  long in_FS_OFFSET;
  QRect local_88;
  QRect local_78;
  QRect local_68;
  QArrayDataPointer<QRect> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (child != (QMdiSubWindow *)0x0 && placer != (Placer *)0x0) {
    this_00 = *(QWidget **)
               &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
                field_0x8;
    if ((this_00->data->widget_attributes & 0x8000) == 0) {
      QPointer<QMdiSubWindow>::QPointer<void>((QPointer<QMdiSubWindow> *)&local_58,child);
      QList<QPointer<QMdiSubWindow>>::emplaceBack<QPointer<QMdiSubWindow>>
                ((QList<QPointer<QMdiSubWindow>> *)&this->pendingPlacements,
                 (QPointer<QMdiSubWindow> *)&local_58);
      QWeakPointer<QObject>::~QWeakPointer((QWeakPointer<QObject> *)&local_58);
    }
    else {
      local_58.d = (Data *)0x0;
      local_58.ptr = (QRect *)0x0;
      local_58.size = 0;
      QList<QRect>::reserve((QList<QRect> *)&local_58,(this->childWindows).d.size);
      local_68 = QWidget::rect(this_00);
      pQVar1 = (this->childWindows).d.ptr;
      lVar2 = (this->childWindows).d.size;
      for (lVar7 = 0; lVar2 << 4 != lVar7; lVar7 = lVar7 + 0x10) {
        lVar3 = *(long *)((long)&(pQVar1->wp).d + lVar7);
        if ((lVar3 == 0) || (*(int *)(lVar3 + 4) == 0)) {
          this_01 = (QWidget *)0x0;
        }
        else {
          this_01 = *(QWidget **)((long)&(pQVar1->wp).value + lVar7);
        }
        bVar5 = sanityCheck((QMdiSubWindow *)this_01,"QMdiArea::place");
        if ((this_01 != &child->super_QWidget) && (bVar5)) {
          bVar5 = QWidget::isVisibleTo(this_01,this_00);
          if (bVar5) {
            bVar5 = QWidget::testAttribute_helper(this_01,WA_Moved);
            if (bVar5) {
              local_78.x1.m_i = 0;
              local_78.y1.m_i = 0;
              local_78.x2.m_i = -1;
              local_78.y2.m_i = -1;
              bVar5 = QWidget::isMaximized(this_01);
              if (bVar5) {
                lVar3 = *(long *)&this_01->field_0x8;
                local_78._0_8_ = *(undefined8 *)(lVar3 + 0x2a8);
                local_78.y2.m_i = *(int *)(lVar3 + 0x2cc) + local_78.y1.m_i + -1;
                local_78.x2.m_i = *(int *)(lVar3 + 0x2c8) + local_78.x1.m_i + -1;
              }
              else {
                pQVar4 = this_01->data;
                local_78.x1.m_i = (pQVar4->crect).x1.m_i;
                local_78.y1.m_i = (pQVar4->crect).y1.m_i;
                local_78.x2.m_i = (pQVar4->crect).x2.m_i;
                local_78.y2.m_i = (pQVar4->crect).y2.m_i;
              }
              LVar6 = QWidget::layoutDirection(&child->super_QWidget);
              local_88 = QStyle::visualRect(LVar6,&local_68,&local_78);
              QList<QRect>::emplaceBack<QRect>((QList<QRect> *)&local_58,&local_88);
            }
          }
        }
      }
      local_78._0_8_ = QWidget::size(&child->super_QWidget);
      local_78.x1.m_i = (**placer->_vptr_Placer)(placer,&local_78,&local_58,&local_68);
      pQVar4 = (child->super_QWidget).data;
      local_78.y1.m_i = extraout_var.m_i;
      local_78.y2.m_i = ((pQVar4->crect).y2.m_i + extraout_var.m_i) - (pQVar4->crect).y1.m_i;
      local_78.x2.m_i = ((pQVar4->crect).x2.m_i + local_78.x1.m_i) - (pQVar4->crect).x1.m_i;
      LVar6 = QWidget::layoutDirection(&child->super_QWidget);
      local_88 = QStyle::visualRect(LVar6,&local_68,&local_78);
      QWidget::setGeometry(&child->super_QWidget,&local_88);
      QArrayDataPointer<QRect>::~QArrayDataPointer(&local_58);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiAreaPrivate::place(Placer *placer, QMdiSubWindow *child)
{
    if (!placer || !child)
        return;

    Q_Q(QMdiArea);
    if (!q->isVisible()) {
        // The window is only laid out when it's added to QMdiArea,
        // so there's no need to check that we don't have it in the
        // list already. appendChild() ensures that.
        pendingPlacements.append(child);
        return;
    }

    QList<QRect> rects;
    rects.reserve(childWindows.size());
    QRect parentRect = q->rect();
    for (QMdiSubWindow *window : std::as_const(childWindows)) {
        if (!sanityCheck(window, "QMdiArea::place") || window == child || !window->isVisibleTo(q)
                || !window->testAttribute(Qt::WA_Moved)) {
            continue;
        }
        QRect occupiedGeometry;
        if (window->isMaximized()) {
            occupiedGeometry = QRect(window->d_func()->oldGeometry.topLeft(),
                                     window->d_func()->restoreSize);
        } else {
            occupiedGeometry = window->geometry();
        }
        rects.append(QStyle::visualRect(child->layoutDirection(), parentRect, occupiedGeometry));
    }
    QPoint newPos = placer->place(child->size(), rects, parentRect);
    QRect newGeometry = QRect(newPos.x(), newPos.y(), child->width(), child->height());
    child->setGeometry(QStyle::visualRect(child->layoutDirection(), parentRect, newGeometry));
}